

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall
Psbt_CreateRecordKey_Test::~Psbt_CreateRecordKey_Test(Psbt_CreateRecordKey_Test *this)

{
  void *in_RDI;
  
  ~Psbt_CreateRecordKey_Test((Psbt_CreateRecordKey_Test *)0x2bd6c8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Psbt, CreateRecordKey) {
  auto key1 = Psbt::CreateRecordKey(1);
  auto key2 = Psbt::CreateRecordKey(2, ByteData("f1f2"));
  auto key3 = Psbt::CreateRecordKey(3, "abc");
  auto key4 = Psbt::CreateRecordKey(4, ByteData("d1d2"), 5);
  auto key5 = Psbt::CreateRecordKey(5, "def", 9);

  EXPECT_STREQ("01", key1.GetHex().c_str());
  EXPECT_STREQ("0202f1f2", key2.GetHex().c_str());
  EXPECT_STREQ("0303616263", key3.GetHex().c_str());
  EXPECT_STREQ("0402d1d205", key4.GetHex().c_str());
  EXPECT_STREQ("050364656609", key5.GetHex().c_str());
}